

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest.hpp
# Opt level: O0

ForContainer<std::set<int>,_std::string> * __thiscall
lest::to_string<std::set<int,std::less<int>,std::allocator<int>>>
          (ForContainer<std::set<int>,_std::string> *__return_storage_ptr__,lest *this,
          set<int,_std::less<int>,_std::allocator<int>_> *cont)

{
  bool bVar1;
  ostream *poVar2;
  int value;
  string local_1e0;
  uint *local_1c0;
  int *x;
  iterator __end0;
  iterator __begin0;
  set<int,_std::less<int>,_std::allocator<int>_> *__range2;
  ostringstream local_190 [8];
  ostringstream os;
  set<int,_std::less<int>,_std::allocator<int>_> *cont_local;
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  std::operator<<((ostream *)local_190,"{ ");
  __end0 = std::set<int,_std::less<int>,_std::allocator<int>_>::begin
                     ((set<int,_std::less<int>,_std::allocator<int>_> *)this);
  x = (int *)std::set<int,_std::less<int>,_std::allocator<int>_>::end
                       ((set<int,_std::less<int>,_std::allocator<int>_> *)this);
  while( true ) {
    bVar1 = std::operator!=(&__end0,(_Self *)&x);
    if (!bVar1) break;
    local_1c0 = (uint *)std::_Rb_tree_const_iterator<int>::operator*(&__end0);
    to_string_abi_cxx11_(&local_1e0,(lest *)(ulong)*local_1c0,value);
    poVar2 = std::operator<<((ostream *)local_190,(string *)&local_1e0);
    std::operator<<(poVar2,", ");
    std::__cxx11::string::~string((string *)&local_1e0);
    std::_Rb_tree_const_iterator<int>::operator++(&__end0);
  }
  std::operator<<((ostream *)local_190,"}");
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return __return_storage_ptr__;
}

Assistant:

auto to_string( C const & cont ) -> ForContainer<C, std::string>
{
    std::ostringstream os;
    os << "{ ";
    for ( auto & x : cont )
    {
        os << to_string( x ) << ", ";
    }
    os << "}";
    return os.str();
}